

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O3

void EVPinit(CManager_conflict cm)

{
  FILE *__stream;
  uint uVar1;
  __pid_t _Var2;
  int iVar3;
  _event_path_data *p_Var4;
  FMContext p_Var5;
  time_t tVar6;
  pthread_t pVar7;
  char *__nptr;
  int iVar8;
  timespec ts;
  timespec local_28;
  
  p_Var4 = (_event_path_data *)INT_CMmalloc(0xd0);
  cm->evp = p_Var4;
  memset(p_Var4,0,0xd0);
  cm->evp->ffsc = cm->FFScontext;
  p_Var5 = (FMContext)FMContext_from_FFS();
  p_Var4 = cm->evp;
  p_Var4->fmc = p_Var5;
  p_Var4->stone_base_num = 0;
  if (EVPinit_first_evpinit == '\x01') {
    tVar6 = time((time_t *)0x0);
    srand((uint)tVar6);
    uVar1 = cm->evp->stone_base_num;
    while (uVar1 == 0) {
      uVar1 = rand();
      uVar1 = uVar1 & 0xffff;
      cm->evp->stone_base_num = uVar1;
    }
  }
  iVar3 = CMtrace_val[10];
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar3 = CMtrace_init(cm,EVerbose);
  }
  if (iVar3 != 0) {
    if (CMtrace_PID != 0) {
      __stream = (FILE *)cm->CMTrace_file;
      _Var2 = getpid();
      pVar7 = pthread_self();
      fprintf(__stream,"P%lxT%lx - ",(long)_Var2,pVar7);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_28);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_28.tv_sec,local_28.tv_nsec);
    }
    fprintf((FILE *)cm->CMTrace_file,"INITATED EVPATH, base stone num is %x\n",
            (ulong)(uint)cm->evp->stone_base_num);
  }
  fflush((FILE *)cm->CMTrace_file);
  EVPinit_first_evpinit = 1;
  p_Var4 = cm->evp;
  p_Var4->queue_items_free_list = (queue_item *)0x0;
  pthread_mutex_init((pthread_mutex_t *)&p_Var4->lock,(pthread_mutexattr_t *)0x0);
  internal_add_shutdown_task(cm,free_evp,(void *)0x0,2);
  __nptr = getenv("EVBackpressure");
  if (__nptr != (char *)0x0) {
    iVar3 = atoi(__nptr);
    iVar8 = 1;
    if (iVar3 != 0) goto LAB_00132e2e;
  }
  iVar8 = 0;
LAB_00132e2e:
  cm->evp->use_backpressure = iVar8;
  INT_CMadd_poll(cm,deferred_process_actions,(void *)0x0);
  REVPinit(cm);
  return;
}

Assistant:

void
EVPinit(CManager cm)
{
    static int first_evpinit = 1;
    cm->evp = INT_CMmalloc(sizeof( struct _event_path_data));
    memset(cm->evp, 0, sizeof( struct _event_path_data));
    cm->evp->ffsc = cm->FFScontext;
    cm->evp->fmc = FMContext_from_FFS(cm->evp->ffsc);
    cm->evp->stone_base_num = 0;
    if (!first_evpinit) {
	/* 
	 * after the first evpinit, start stones at random base number,
	 * just so that we're more likely to catch mitmatched stone/CM
	 * combos in threaded situations.
	*/
	srand((int)time(NULL));
	while (cm->evp->stone_base_num == 0) {
	    cm->evp->stone_base_num = rand() & 0xffff;
	}
    }
    CMtrace_out(cm, EVerbose, "INITATED EVPATH, base stone num is %x\n", 
		cm->evp->stone_base_num);
    first_evpinit = 0;
    cm->evp->queue_items_free_list = NULL;
    thr_mutex_init(cm->evp->lock);
    internal_add_shutdown_task(cm, free_evp, NULL, FREE_TASK);
    {
        char *backpressure_env;
        backpressure_env = getenv("EVBackpressure");
        if (backpressure_env && atoi(backpressure_env) != 0) {
            cm->evp->use_backpressure = 1;
        } else {
            cm->evp->use_backpressure = 0;
        }
    }
    INT_CMadd_poll(cm, deferred_process_actions, NULL);
    REVPinit(cm);
}